

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupPiPerm(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pGVar14;
  Gia_Man_t *pGVar15;
  long lVar16;
  uint iLit0;
  long lVar17;
  uint uVar18;
  
  Gia_ManRandom(1);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_00->pName = pcVar12;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_00->pSpec = pcVar12;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar13 = p->vCis;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      iVar10 = pVVar13->pArray[lVar16];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_001dc0a9;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar14 = Gia_ManAppendObj(p_00);
      uVar6 = *(ulong *)pGVar14;
      *(ulong *)pGVar14 = uVar6 | 0x9fffffff;
      *(ulong *)pGVar14 =
           uVar6 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_00->pObjs;
      if ((pGVar14 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar14)) {
LAB_001dc0c8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar14 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar14)) goto LAB_001dc0c8;
      pGVar5[iVar10].Value = (int)((ulong)((long)pGVar14 - (long)pGVar7) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar13 = p->vCis;
    } while (lVar16 < pVVar13->nSize);
  }
  iVar10 = p->nObjs;
  if (0 < iVar10) {
    lVar17 = 8;
    lVar16 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar6 = *(ulong *)((long)pGVar5 + lVar17 + -8);
      if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        uVar18 = *(uint *)((long)pGVar5 +
                          lVar17 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3);
        if (((int)uVar18 < 0) ||
           (uVar1 = *(uint *)((long)pGVar5 +
                             lVar17 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001dc0e7;
        iLit0 = (uint)(uVar6 >> 0x1d) & 1 ^ uVar18;
        uVar8 = Gia_ManRandom(0);
        uVar2 = p->vCis->nSize;
        uVar9 = Gia_ManRandom(0);
        uVar3 = p->vCis->nSize;
        if ((int)(uVar18 >> 1) <= (int)uVar3) {
          uVar8 = uVar8 % uVar2;
          if ((int)uVar8 < -1) goto LAB_001dc106;
          iLit0 = (iLit0 & 1) + uVar8 * 2 + 2;
        }
        uVar18 = (uint)(uVar6 >> 0x3d) & 1 ^ uVar1;
        if ((int)(uVar1 >> 1) <= (int)uVar3) {
          if ((int)(uVar9 % uVar3) < -1) {
LAB_001dc106:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uVar18 = (uVar18 & 1) + (uVar9 % uVar3) * 2 + 2;
        }
        iVar10 = Gia_ManHashAnd(p_00,iLit0,uVar18);
        *(int *)(&pGVar5->field_0x0 + lVar17) = iVar10;
        iVar10 = p->nObjs;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar16 < iVar10);
  }
  pVVar13 = p->vCos;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      iVar10 = pVVar13->pArray[lVar16];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_001dc0a9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar10;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_001dc0e7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar18 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                    pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value
                              );
      pGVar5->Value = uVar18;
      lVar16 = lVar16 + 1;
      pVVar13 = p->vCos;
    } while (lVar16 < pVVar13->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar15 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar15;
}

Assistant:

Gia_Man_t * Gia_ManDupPiPerm( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManRandom(1);
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iLit0 = Gia_ObjFanin0Copy(pObj);
        int iLit1 = Gia_ObjFanin1Copy(pObj);
        int iPlace0 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        int iPlace1 = Gia_ManRandom(0) % Gia_ManCiNum(p);
        if ( Abc_Lit2Var(iLit0) <= Gia_ManCiNum(p) )
            iLit0 = Abc_Var2Lit( iPlace0+1, Abc_LitIsCompl(iLit0) );
        if ( Abc_Lit2Var(iLit1) <= Gia_ManCiNum(p) )
            iLit1 = Abc_Var2Lit( iPlace1+1, Abc_LitIsCompl(iLit1) );
        pObj->Value = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}